

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorldImporter.cpp
# Opt level: O0

btCollisionShape * __thiscall
btCollisionWorldImporter::createSphereShape(btCollisionWorldImporter *this,btScalar radius)

{
  btCollisionShape *this_00;
  btSphereShape *shape;
  btSphereShape *in_stack_ffffffffffffffd0;
  
  this_00 = (btCollisionShape *)btSphereShape::operator_new(0x1875b3);
  btSphereShape::btSphereShape(in_stack_ffffffffffffffd0,(btScalar)((ulong)this_00 >> 0x20));
  btAlignedObjectArray<btCollisionShape_*>::push_back
            ((btAlignedObjectArray<btCollisionShape_*> *)this_00,(btCollisionShape **)this_00);
  return this_00;
}

Assistant:

btCollisionShape* btCollisionWorldImporter::createSphereShape(btScalar radius)
{
	btSphereShape* shape = new btSphereShape(radius);
	m_allocatedCollisionShapes.push_back(shape);
	return shape;
}